

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperture_solver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Station *pSVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  time_t tVar20;
  char *pcVar21;
  ostream *poVar22;
  ApertureILS *this;
  ILS *this_00;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  int n;
  int n_00;
  int i_1;
  int i;
  char *pcVar23;
  byte search_aperture;
  long lVar24;
  byte search_intensity;
  _List_node_base *p_Var25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Db;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<args::EitherFlag> in_18;
  initializer_list<args::EitherFlag> in_19;
  initializer_list<args::EitherFlag> in_20;
  initializer_list<args::EitherFlag> in_21;
  initializer_list<args::EitherFlag> in_22;
  initializer_list<args::EitherFlag> in_23;
  initializer_list<args::EitherFlag> in_24;
  initializer_list<args::EitherFlag> in_25;
  initializer_list<args::EitherFlag> in_26;
  initializer_list<args::EitherFlag> in_27;
  initializer_list<args::EitherFlag> in_28;
  initializer_list<args::EitherFlag> in_29;
  initializer_list<args::EitherFlag> in_30;
  initializer_list<args::EitherFlag> in_31;
  initializer_list<args::EitherFlag> in_32;
  initializer_list<args::EitherFlag> in_33;
  initializer_list<args::EitherFlag> in_34;
  initializer_list<args::EitherFlag> in_35;
  initializer_list<args::EitherFlag> in_36;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  int local_2980;
  int local_297c;
  int local_296c;
  int local_2968;
  int local_2964;
  int local_295c;
  int local_2958;
  int local_2954;
  int local_2950;
  int local_294c;
  uint local_2948;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  string strategy;
  double local_2740;
  uint local_2738;
  double local_2728;
  IntensityGenerator intgen;
  string local_2718 [8];
  undefined1 local_2710 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2708;
  EitherFlag local_26f8 [8];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file3;
  Collimator collimator;
  double local_2200;
  double local_21f8;
  double local_21f0;
  set<int,_std::less<int>,_std::allocator<int>_> l;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  vector<double,_std::allocator<double>_> w;
  string s;
  string file;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  tabu_list_aper;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  tabu_list_inten;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  _Vector_base<double,_std::allocator<double>_> local_20e0;
  _Vector_base<double,_std::allocator<double>_> local_20c8;
  _Vector_base<double,_std::allocator<double>_> local_20b0;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  Plan P;
  string path;
  string file2;
  string local_1f58;
  string local_1f38;
  string local_1f18;
  string local_1ef8;
  Group dao_ls;
  ArgumentParser parser;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1ce0;
  Group setup;
  Flag _plot;
  string local_1b80;
  string local_1b60;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<double,_args::ValueReader<double>_> _temperature;
  ValueFlag<double,_args::ValueReader<double>_> _prob_intensity;
  Group accept;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _strategy;
  ValueFlag<double,_args::ValueReader<double>_> _alphaT;
  Flag ls_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _perturbation;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  Flag accept_sa;
  Flag accept_best;
  Flag do_perturbate;
  Flag first_improv;
  Flag best_improv;
  Flag ls_aperture;
  Flag _targeted_search;
  Flag all_rand;
  Flag closed_max;
  Flag closed_min;
  Flag open_min;
  Flag open_max;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  HelpFlag help;
  
  tVar20 = time((time_t *)0x0);
  local_2948 = (uint)tVar20;
  std::__cxx11::string::string((string *)&strategy,"dao_ls",(allocator *)&collimator);
  std::__cxx11::string::string
            ((string *)&file,"data/testinstance_0_70_140_210_280.txt",(allocator *)&collimator);
  std::__cxx11::string::string
            ((string *)&file2,"data/test_instance_coordinates.txt",(allocator *)&collimator);
  std::__cxx11::string::string((string *)&path,".",(allocator *)&collimator);
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&collimator,"********* IMRT-Solver (Aperture solver) *********",
             (allocator *)&_strategy);
  std::__cxx11::string::string
            ((string *)&intgen,
             "Example.\n./AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,(allocator *)&_file);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&intgen);
  std::__cxx11::string::~string((string *)&intgen);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_strategy,"help",(allocator *)&_file2);
  std::__cxx11::string::string((string *)&_file,"Display this help menu",(allocator *)&_file3);
  intgen._vptr_IntensityGenerator._0_2_ = 0x6801;
  local_2710 = (undefined1  [8])0x0;
  local_2708._0_8_ = local_2708._0_8_ & 0xffffffffffffff00;
  local_2718 = (string  [8])&local_2708;
  args::EitherFlag::EitherFlag(local_26f8,"help");
  in._M_len = 2;
  in._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::HelpFlag::HelpFlag
            (&help,&parser.super_Group,(string *)&_strategy,(string *)&_file,(Matcher *)&collimator)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar24 = 0x30;
  do {
    std::__cxx11::string::~string((string *)((long)&intgen._vptr_IntensityGenerator + lVar24));
    lVar24 = lVar24 + -0x28;
  } while (lVar24 != -0x20);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::~string((string *)&_strategy);
  std::__cxx11::string::string((string *)&_file,"string",(allocator *)&_path);
  std::__cxx11::string::string((string *)&_file2,"Strategy  (dao_ls|ibo_ls)",(allocator *)&_alpha);
  intgen._vptr_IntensityGenerator._0_2_ = 0x7301;
  local_2710 = (undefined1  [8])0x0;
  local_2708._0_8_ = local_2708._0_8_ & 0xffffffffffffff00;
  local_2718 = (string  [8])&local_2708;
  args::EitherFlag::EitherFlag(local_26f8,"strategy");
  in_00._M_len = 2;
  in_00._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_00);
  _file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  _file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched = false;
  _file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._9_7_ = 0;
  _file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ =
       0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_strategy,&parser.super_Group,(string *)&_file,(string *)&_file2,
              (Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,false);
  std::__cxx11::string::~string((string *)&_file3);
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar24 = 0x30;
  do {
    std::__cxx11::string::~string((string *)((long)&intgen._vptr_IntensityGenerator + lVar24));
    lVar24 = lVar24 + -0x28;
  } while (lVar24 != -0x20);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  local_2954 = 0x14;
  std::__cxx11::to_string((string *)&_path,0x14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Number of considered beamlets for selection (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"bsize");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_01);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_bsize,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  local_2958 = 0x32;
  std::__cxx11::to_string((string *)&_path,0x32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Number of considered worst voxels (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"vsize");
  in_02._M_len = 1;
  in_02._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_02);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_vsize,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  std::__cxx11::to_string((string *)&_path,5.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Max delta  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"maxdelta");
  in_03._M_len = 1;
  in_03._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_03);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxdelta,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  std::__cxx11::to_string((string *)&_path,3.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Max ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"maxratio");
  in_04._M_len = 1;
  in_04._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_04);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxratio,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  std::__cxx11::to_string((string *)&_path,5000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Number of iterations (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"maxiter");
  in_05._M_len = 1;
  in_05._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_05);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxiter,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator
             ,(int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  std::__cxx11::to_string((string *)&_path,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Maximum time in seconds (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"maxtime");
  in_06._M_len = 1;
  in_06._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_06);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxtime,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator
             ,(int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_beta);
  std::__cxx11::to_string((string *)&_path,local_2948);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Seed  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"seed");
  in_07._M_len = 1;
  in_07._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_07);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_seed,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_alpha,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_prob_intensity);
  std::__cxx11::to_string((string *)&_path,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Initial temperature for intensities  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"alpha");
  in_08._M_len = 1;
  in_08._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_08);
  _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base = (_func_int **)0x0
  ;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alpha,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_beta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_temperature);
  local_21f8 = 1.0;
  std::__cxx11::to_string((string *)&_path,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Initial temperature for ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"beta");
  in_09._M_len = 1;
  in_09._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_09);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_beta,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string
            ((string *)&collimator,
             "Initial solution setup (these override all provided configurations):",
             (allocator *)&_file);
  local_2718 = (string  [8])0x0;
  intgen._vptr_IntensityGenerator = (_func_int **)args::Group::Validators::DontCare;
  local_2708._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2710 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&setup,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&intgen);
  std::_Function_base::~_Function_base((_Function_base *)&intgen);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"open_max",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Open aperture setup with max intensity",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"open-max-setup");
  in_10._M_len = 1;
  in_10._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_10);
  args::Flag::Flag(&open_max,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"open_min",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Open aperture setup with min intensity",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"open-min-setup");
  in_11._M_len = 1;
  in_11._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_11);
  args::Flag::Flag(&open_min,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"closed_min",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Closed aperture setup with min intensity",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"closed-min-setup");
  in_12._M_len = 1;
  in_12._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_12);
  args::Flag::Flag(&closed_min,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"closed_max",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Closed aperture setup with max intensity",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"closed-max-setup");
  in_13._M_len = 1;
  in_13._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_13);
  args::Flag::Flag(&closed_max,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"all_rand",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Random aperture setup with random intensity",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"rand-setup");
  in_14._M_len = 1;
  in_14._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_14);
  args::Flag::Flag(&all_rand,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_temperature);
  local_294c = 5;
  std::__cxx11::to_string((string *)&_path,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Initial intensity for the station  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"max-apertures");
  in_15._M_len = 1;
  in_15._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_15);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
               _vptr_Base & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_apertures,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_temperature);
  local_2950 = -1;
  std::__cxx11::to_string((string *)&_path,-1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Number of initialized open apertures (-1: all, default:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"open-apertures");
  in_16._M_len = 1;
  in_16._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_16);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
               _vptr_Base & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_open_apertures,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_temperature);
  std::__cxx11::to_string((string *)&_path,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Initial value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"initial-intensity");
  in_17._M_len = 1;
  in_17._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_17);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
               _vptr_Base & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_initial_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_temperature);
  local_2968 = 0x1c;
  std::__cxx11::to_string((string *)&_path,0x1c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Max value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"max-intensity");
  in_18._M_len = 1;
  in_18._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_18);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
               _vptr_Base & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_temperature);
  std::__cxx11::to_string((string *)&_path,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Step size for aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"step-intensity");
  in_19._M_len = 1;
  in_19._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_19);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
               _vptr_Base & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_step_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string
            ((string *)&collimator,"Direct aperture local search:",(allocator *)&_file);
  local_2718 = (string  [8])0x0;
  intgen._vptr_IntensityGenerator = (_func_int **)args::Group::Validators::DontCare;
  local_2708._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2710 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&dao_ls,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&intgen);
  std::_Function_base::~_Function_base((_Function_base *)&intgen);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"targeted_search",(allocator *)&_file3);
  std::__cxx11::string::string((string *)&_file2,"Apply targeted local search",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"targeted");
  in_20._M_len = 1;
  in_20._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_20);
  args::Flag::Flag(&_targeted_search,&dao_ls,(string *)&_file,(string *)&_file2,
                   (Matcher *)&collimator,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"ls_apertures",(allocator *)&_file3);
  std::__cxx11::string::string((string *)&_file2,"Apply aperture local search",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"ls-aperture");
  in_21._M_len = 1;
  in_21._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_21);
  args::Flag::Flag(&ls_aperture,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"ls_intensity",(allocator *)&_file3);
  std::__cxx11::string::string((string *)&_file2,"Apply intensity local search",(allocator *)&_path)
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"ls-intensity");
  in_22._M_len = 1;
  in_22._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_22);
  args::Flag::Flag(&ls_intensity,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_alphaT);
  local_2728 = 0.2;
  std::__cxx11::to_string((string *)&_path,0.2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Probability to search over intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"prob-intensity");
  in_23._M_len = 1;
  in_23._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_23);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_prob_intensity,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"best_improv",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Apply best improvement when searching intensity or apertures",
             (allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"best-improvement");
  in_24._M_len = 1;
  in_24._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_24);
  args::Flag::Flag(&best_improv,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"first_improv",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Apply first improvement when searching intensity or apertures",
             (allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"first-improvement");
  in_25._M_len = 1;
  in_25._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_25);
  args::Flag::Flag(&first_improv,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"do_perturbate",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Perturbate after a selected criterion is triggered",
             (allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"perturbate");
  in_26._M_len = 1;
  in_26._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_26);
  args::Flag::Flag(&do_perturbate,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  local_2964 = 2;
  std::__cxx11::to_string((string *)&_path,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Perturbation size  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"perturbation-size");
  in_27._M_len = 1;
  in_27._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_27);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_perturbation,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&collimator,"Acceptance criterion:",(allocator *)&_file);
  local_2718 = (string  [8])0x0;
  intgen._vptr_IntensityGenerator = (_func_int **)args::Group::Validators::AtMostOne;
  local_2708._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_2710 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&accept,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&intgen);
  std::_Function_base::~_Function_base((_Function_base *)&intgen);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"accept-best",(allocator *)&_file3);
  std::__cxx11::string::string((string *)&_file2,"Accept only improvement",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"accept-best");
  in_28._M_len = 1;
  in_28._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_28);
  args::Flag::Flag(&accept_best,&accept,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"accept-sa",(allocator *)&_file3);
  std::__cxx11::string::string
            ((string *)&_file2,"Accept as simulated annealing",(allocator *)&_path);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"accept-sa");
  in_29._M_len = 1;
  in_29._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_29);
  args::Flag::Flag(&accept_sa,&accept,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  dVar2 = (double)std::__cxx11::string::string((string *)&_file,"double",(allocator *)&P);
  std::__cxx11::to_string((string *)&_path,dVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Temperature for acceptance criterion  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"temperature");
  in_30._M_len = 1;
  in_30._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_30);
  _alphaT.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_temperature,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(double *)&_alphaT,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_plot);
  local_21f0 = 0.95;
  std::__cxx11::to_string((string *)&_path,0.95);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,
                 "Reduction rate of the temperature  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file3,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"alphaT");
  in_31._M_len = 1;
  in_31._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_31);
  P._vptr_Plan = (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alphaT,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&P,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file2,"string",(allocator *)&P);
  std::__cxx11::string::string
            ((string *)&_file3,"File with the deposition matrix",(allocator *)&_plot);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"file-dep");
  in_32._M_len = 1;
  in_32._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_32);
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched = false;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._9_7_ = 0;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ =
       0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file,&parser.super_Group,(string *)&_file2,(string *)&_file3,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,false);
  std::__cxx11::string::~string((string *)&_path);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file3,"string",(allocator *)&_plot);
  std::__cxx11::string::string((string *)&_path,"File with the beam coordinates",(allocator *)&l);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"file-coord");
  in_33._M_len = 1;
  in_33._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_33);
  P._vptr_Plan = (_func_int **)&P.angle2station._M_t._M_impl.super__Rb_tree_header;
  P.angle2station._M_t._M_impl._0_8_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file2,&parser.super_Group,(string *)&_file3,(string *)&_path,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P,false);
  std::__cxx11::string::~string((string *)&P);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file3);
  std::__cxx11::string::string((string *)&_path,"string",(allocator *)&l);
  std::__cxx11::string::string((string *)&P,"File with initial intensities",(allocator *)&s);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"file-sol");
  in_34._M_len = 1;
  in_34._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_34);
  _plot.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_plot.super_FlagBase.super_NamedBase.super_Base.help;
  _plot.super_FlagBase.super_NamedBase.super_Base.matched = false;
  _plot.super_FlagBase.super_NamedBase.super_Base._9_7_ = 0;
  _plot.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file3,&parser.super_Group,(string *)&_path,(string *)&P,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_plot,false);
  std::__cxx11::string::~string((string *)&_plot);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::string((string *)&P,"string",(allocator *)&s);
  std::__cxx11::string::string
            ((string *)&_plot,
             "Absolute path of the executable (if it is executed from other directory)",
             (allocator *)&w);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"path");
  in_35._M_len = 1;
  in_35._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_35);
  l._M_t._M_impl._0_8_ = &l._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  l._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  l._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  l._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_path,&parser.super_Group,(string *)&P,(string *)&_plot,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,false);
  std::__cxx11::string::~string((string *)&l);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&_plot);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::string((string *)&P,"bool",(allocator *)&s);
  std::__cxx11::string::string((string *)&l,"Generate plot and save in file",(allocator *)&w);
  args::EitherFlag::EitherFlag((EitherFlag *)&intgen,"plot");
  in_36._M_len = 1;
  in_36._M_array = (iterator)&intgen;
  args::Matcher::Matcher((Matcher *)&collimator,in_36);
  args::Flag::Flag(&_plot,&parser.super_Group,(string *)&P,(string *)&l,(Matcher *)&collimator,false
                  );
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_2718);
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)&P);
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  iVar11 = (*_strategy.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar11 != '\0') {
    std::__cxx11::string::_M_assign((string *)&strategy);
  }
  iVar11 = (*_bsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar11 != '\0') {
    local_2954 = _bsize.value;
  }
  iVar11 = (*_vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar11 != '\0') {
    local_2958 = _vsize.value;
  }
  iVar11 = (*_maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     (&_maxdelta);
  local_2740 = (double)_maxdelta.value;
  iVar12 = (*_maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     (&_maxratio);
  local_2200 = (double)_maxratio.value;
  iVar13 = (*_maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])()
  ;
  local_295c = 5000;
  if ((char)iVar13 != '\0') {
    local_295c = _maxiter.value;
  }
  iVar13 = (*_maxtime.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])()
  ;
  local_296c = 0;
  if ((char)iVar13 != '\0') {
    local_296c = _maxtime.value;
  }
  iVar13 = (*_seed.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    local_2948 = _seed.value;
  }
  cVar7 = (**(code **)(CONCAT44(_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base
                                ._vptr_Base._4_4_,
                                _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base
                                ._vptr_Base._0_4_) + 0x10))();
  if (cVar7 == '\0') {
    uVar26 = 0;
    uVar28 = 0x3ff00000;
  }
  else {
    uVar26 = SUB84(_alpha.value,0);
    uVar28 = (undefined4)((ulong)_alpha.value >> 0x20);
  }
  iVar13 = (*_beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    local_21f8 = _beta.value;
  }
  iVar13 = (*_max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
             [2])();
  if ((char)iVar13 != '\0') {
    local_294c = _max_apertures.value;
  }
  iVar13 = (*_open_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
             _vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    local_2950 = _open_apertures.value;
  }
  iVar14 = (*_initial_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
             _vptr_Base[2])();
  iVar13 = 2;
  if ((char)iVar14 != '\0') {
    iVar13 = _initial_intensity.value;
  }
  iVar14 = (*_max_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
             [2])();
  if ((char)iVar14 != '\0') {
    local_2968 = _max_intensity.value;
  }
  iVar14 = (*_step_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
             _vptr_Base[2])();
  if ((char)iVar14 != '\0') {
    local_2964 = _step_intensity.value;
  }
  iVar14 = (*_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
             _vptr_Base[2])();
  if ((char)iVar14 != '\0') {
    local_2728 = _prob_intensity.value;
  }
  iVar14 = (*_targeted_search.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar15 = (*ls_aperture.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])(&ls_aperture);
  search_aperture = (byte)iVar15;
  iVar15 = (*ls_intensity.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  search_intensity = (byte)iVar15;
  iVar15 = (*ls_aperture.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])(&ls_aperture);
  if ((char)iVar15 == '\0') {
    iVar15 = (*ls_intensity.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
    bVar8 = (byte)iVar15 ^ 1;
    search_aperture = search_aperture | bVar8;
    search_intensity = search_intensity | bVar8;
  }
  iVar16 = (*_perturbation.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
             [2])();
  iVar15 = _perturbation.value;
  if ((char)iVar16 == '\0') {
    iVar15 = 2;
  }
  (*first_improv.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  uVar17 = (*best_improv.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar16 = (*accept_sa.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar18 = (*accept_best.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar19 = (*_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
             [2])(&_temperature);
  uVar27 = SUB84(_temperature.value,0);
  uVar29 = (undefined4)((ulong)_temperature.value >> 0x20);
  if ((char)iVar19 == '\0') {
    uVar27 = 0;
    uVar29 = 0x40240000;
  }
  iVar19 = (*_alphaT.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar19 != '\0') {
    local_21f0 = _alphaT.value;
  }
  iVar19 = (*open_max.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  local_2980 = 0;
  cVar7 = (char)iVar19;
  if (cVar7 == '\0') {
    iVar19 = (*open_min.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
    if ((char)iVar19 == '\0') {
      iVar19 = (*closed_min.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
      if ((char)iVar19 != '\0') {
        local_297c = 2;
        bVar4 = true;
        local_2980 = 0;
        bVar10 = false;
        goto LAB_00108cb1;
      }
      iVar19 = (*closed_max.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
      if ((char)iVar19 != '\0') {
        local_297c = 3;
        bVar10 = true;
        local_2980 = local_2968;
        goto LAB_00108caf;
      }
      iVar19 = (*all_rand.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
      local_2980 = iVar13;
      if ((char)iVar19 == '\0') {
        local_297c = 6;
        goto LAB_00108cac;
      }
      bVar10 = std::operator==(&strategy,"dao_ls");
      if (!bVar10) {
        std::operator==(&strategy,"ibo_ls");
        local_297c = 5;
        bVar6 = true;
        bVar5 = false;
        bVar10 = false;
        bVar4 = false;
        bVar3 = false;
        goto LAB_00108cf2;
      }
      local_297c = 4;
      bVar3 = true;
      bVar10 = false;
      bVar4 = false;
      goto LAB_00108cb4;
    }
    bVar5 = true;
    bVar10 = false;
    bVar4 = false;
    bVar3 = false;
    bVar6 = false;
    local_297c = 0;
  }
  else {
    local_297c = 1;
    local_2980 = local_2968;
LAB_00108cac:
    bVar10 = false;
LAB_00108caf:
    bVar4 = false;
LAB_00108cb1:
    bVar3 = false;
LAB_00108cb4:
    bVar5 = false;
    bVar6 = false;
  }
LAB_00108cf2:
  srand(local_2948);
  iVar13 = (*_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file);
  }
  iVar13 = (*_file2.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file2);
  }
  iVar13 = (*_file3.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 == '\0') {
    pcVar21 = (char *)0x0;
  }
  else {
    pcVar21 = strdup(_file3.value._M_dataplus._M_p);
  }
  iVar13 = (*_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar13 != '\0') {
    std::__cxx11::string::_M_assign((string *)&path);
  }
  chdir(path._M_dataplus._M_p);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  bVar9 = std::operator==(&strategy,"dao_ls");
  if (bVar9) {
    pcVar23 = "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********";
  }
  else {
    bVar9 = std::operator==(&strategy,"ibo_ls");
    if (!bVar9) goto LAB_00108e31;
    pcVar23 = "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********";
  }
  poVar22 = std::operator<<((ostream *)&std::cout,pcVar23);
  std::endl<char,std::char_traits<char>>(poVar22);
LAB_00108e31:
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&intgen);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&intgen);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x4050400000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x404e0000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&intgen);
  std::__cxx11::string::string((string *)&local_1ef8,(string *)&file2);
  std::__cxx11::string::string((string *)&local_1f18,(string *)&file);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1ce0,&local_1f18,n);
  imrt::Collimator::Collimator
            (&collimator,&local_1ef8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1ce0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1ce0);
  std::__cxx11::string::~string((string *)&local_1f18);
  std::__cxx11::string::~string((string *)&local_1ef8);
  std::__cxx11::string::string((string *)&local_1f38,(string *)&file);
  createVolumes(&volumes,&local_1f38,&collimator);
  std::__cxx11::string::~string((string *)&local_1f38);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20b0,&w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20c8,&Zmin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20e0,&Zmax);
  imrt::Plan::Plan(&P,(vector<double,_std::allocator<double>_> *)&local_20b0,
                   (vector<double,_std::allocator<double>_> *)&local_20c8,
                   (vector<double,_std::allocator<double>_> *)&local_20e0,&collimator,&volumes,
                   local_294c,local_2968,local_2980,local_2964,local_2950,local_297c,pcVar21);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20e0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20b0);
  dVar2 = imrt::Plan::getEvaluation(&P);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<(poVar22,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##*********************************** INFO *********************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<(poVar22,"## Solver: ");
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Iterations: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_295c);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Time: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_296c);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Seed: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2948);
  std::endl<char,std::char_traits<char>>(poVar22);
  std::operator<<((ostream *)&std::cout,"##   Temperature: ");
  poVar22 = std::ostream::_M_insert<double>(_temperature.value);
  std::endl<char,std::char_traits<char>>(poVar22);
  std::operator<<((ostream *)&std::cout,"##   alpha: ");
  poVar22 = std::ostream::_M_insert<double>((double)CONCAT44(uVar28,uVar26));
  std::endl<char,std::char_traits<char>>(poVar22);
  if ((bool)search_aperture != false) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Searching: aperture pattern");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  if ((bool)search_intensity != false) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Searching: intensity");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  std::operator<<((ostream *)&std::cout,"##   Probability intensity ls: ");
  poVar22 = std::ostream::_M_insert<double>(local_2728);
  std::endl<char,std::char_traits<char>>(poVar22);
  bVar9 = std::operator==(&strategy,"dao_ls");
  if ((bVar9 & ((byte)uVar17 ^ 1)) == 1) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Local search: first improvement");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  bVar9 = std::operator==(&strategy,"dao_ls");
  local_2738 = uVar17 & 0xff;
  if (((uVar17 & 0xff) != 0) && (bVar9)) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Local search: best improvement");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  bVar9 = std::operator==(&strategy,"dao_ls");
  if ((bVar9 & (byte)iVar14) == 1) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Targeted search: yes");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  bVar9 = std::operator==(&strategy,"dao_ls");
  if ((byte)iVar14 == 0 && bVar9) {
    poVar22 = std::operator<<((ostream *)&std::cout,"##   Targeted search: no");
    std::endl<char,std::char_traits<char>>(poVar22);
  }
  poVar22 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,"##   Open initial setup: ");
  pcVar21 = "random";
  if (bVar4) {
    pcVar21 = "closed min intensity";
  }
  pcVar23 = "closed max intensity";
  if (!bVar10) {
    pcVar23 = pcVar21;
  }
  pcVar21 = "open min intensity";
  if (!bVar5) {
    pcVar21 = pcVar23;
  }
  pcVar23 = "open max intensity";
  if (cVar7 == '\0') {
    pcVar23 = pcVar21;
  }
  if ((((!bVar4 && !bVar10) && (!bVar3 && !bVar6)) && !bVar5) && cVar7 == '\0') {
    poVar22 = std::operator<<((ostream *)&std::cout,"manual, ");
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2950);
    pcVar23 = " open apertures";
  }
  poVar22 = std::operator<<(poVar22,pcVar23);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Initial intensity: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2980);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Max intensity: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2968);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Step intensity: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2964);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Perturbation size: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar15);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<(poVar22,"## Colimator configuration: ");
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Stations: ");
  iVar13 = imrt::Collimator::getNbAngles(&collimator);
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar13);
  std::endl<char,std::char_traits<char>>(poVar22);
  std::operator<<((ostream *)&std::cout,"##   Angles: ");
  for (iVar13 = 0; iVar14 = imrt::Collimator::getNbAngles(&collimator), iVar13 < iVar14;
      iVar13 = iVar13 + 1) {
    iVar14 = imrt::Collimator::getAngle(&collimator,iVar13);
    poVar22 = (ostream *)std::ostream::operator<<(&std::cout,iVar14);
    std::operator<<(poVar22," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Apertures: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_294c);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<(poVar22,"## Instance information: ");
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##   Volumes: ");
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<(poVar22,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##********************************** SEARCH ********************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  std::operator<<((ostream *)&std::cout,"## Initial solution: ");
  poVar22 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  std::endl<char,std::char_traits<char>>(poVar22);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (iVar13 = 0; iVar13 != 5; iVar13 = iVar13 + 1) {
    imrt::Plan::printIntensity(&P,iVar13);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar10 = std::operator==(&strategy,"dao_ls");
  if (bVar10) {
    this = (ApertureILS *)operator_new(0x78);
    iVar11 = (*do_perturbate.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
    imrt::ApertureILS::ApertureILS
              (this,local_2954,local_2958,(bool)search_intensity,(bool)search_aperture,local_2728,
               local_2964,(double)CONCAT44(uVar29,uVar27),local_21f0,SUB41(iVar11,0),iVar15,
               (uint)(byte)((byte)iVar16 & ((byte)iVar18 ^ 1)),local_2738);
    imrt::ILS::notTargetedSearch((ILS *)this,&P,local_296c,local_295c);
  }
  else {
    bVar10 = std::operator==(&strategy,"ibo_ls");
    if (bVar10) {
      this_00 = (ILS *)operator_new(0x60);
      this_00->max_no_improvement = 100.0;
      this_00->bsize = local_2954;
      this_00->vsize = local_2958;
      this_00->acceptance = 0;
      this_00->_vptr_ILS = (_func_int **)&PTR__ILS_00139cd0;
      *(int *)&this_00->field_0x24 = local_2964;
      *(int *)&this_00[1]._vptr_ILS = iVar15;
      if ((char)iVar11 == '\0') {
        local_2740 = 5.0;
      }
      this_00[1].max_no_improvement = local_2740;
      if ((char)iVar12 == '\0') {
        local_2200 = 3.0;
      }
      this_00[1].time_begin = (clock_t)local_2200;
      *(double *)&this_00[1].bsize = local_2740;
      *(double *)&this_00[1].acceptance = local_2200;
      this_00[2]._vptr_ILS = (_func_int **)CONCAT44(uVar28,uVar26);
      this_00[2].max_no_improvement = local_21f8;
      imrt::ILS::beamTargetedSearch(this_00,&P,local_296c,local_295c);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      for (iVar11 = 0; iVar11 != 5; iVar11 = iVar11 + 1) {
        imrt::Plan::printIntensity(&P,iVar11);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      iVar11 = 0x32;
      while (bVar10 = iVar11 != 0, iVar11 = iVar11 + -1, bVar10) {
        (*this_00->_vptr_ILS[3])(0,this_00,&P,1);
        poVar22 = std::ostream::_M_insert<double>
                            ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::endl<char,std::char_traits<char>>(poVar22);
      }
      dVar2 = imrt::Plan::eval(&P);
      poVar22 = std::ostream::_M_insert<double>(dVar2);
      std::endl<char,std::char_traits<char>>(poVar22);
    }
    else {
      bVar10 = std::operator==(&strategy,"intgen");
      if (bVar10) {
        imrt::IntensityGenerator::IntensityGenerator(&intgen);
        imrt::IntensityGenerator::generate(&intgen,&P);
        imrt::IntensityGenerator::~IntensityGenerator(&intgen);
      }
    }
  }
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##******************************* RESULTS **********************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar22);
  poVar22 = std::operator<<((ostream *)&std::cout,"##");
  std::endl<char,std::char_traits<char>>(poVar22);
  std::operator<<((ostream *)&std::cout,"## Best solution found: ");
  dVar2 = imrt::Plan::getEvaluation(&P);
  poVar22 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar22);
  dVar2 = imrt::Plan::getEvaluation(&P);
  poVar22 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar22," ");
  __x = imrt::Plan::get_stations_abi_cxx11_(&P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&stations,__x);
  iVar11 = 0;
  p_Var25 = (_List_node_base *)&stations;
  while (p_Var25 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                    &p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var25 != (_List_node_base *)&stations) {
    pSVar1 = (Station *)p_Var25[1]._M_next;
    std::__cxx11::string::string((string *)&local_1b60,(string *)&strategy);
    iVar12 = imrt::Station::get_sum_alpha(pSVar1,&local_1b60);
    std::__cxx11::string::~string((string *)&local_1b60);
    poVar22 = (ostream *)std::ostream::operator<<(&std::cout,iVar12);
    std::operator<<(poVar22," ");
    iVar11 = iVar11 + iVar12;
  }
  poVar22 = (ostream *)std::ostream::operator<<(&std::cout,iVar11);
  std::operator<<(poVar22," ");
  iVar11 = 0;
  p_Var25 = (_List_node_base *)&stations;
  while (p_Var25 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                    &p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var25 != (_List_node_base *)&stations) {
    pSVar1 = (Station *)p_Var25[1]._M_next;
    std::__cxx11::string::string((string *)&local_1b80,(string *)&strategy);
    iVar12 = imrt::Station::get_nb_apertures(pSVar1,&local_1b80);
    std::__cxx11::string::~string((string *)&local_1b80);
    poVar22 = (ostream *)std::ostream::operator<<(&std::cout,iVar12);
    std::operator<<(poVar22," ");
    iVar11 = iVar11 + iVar12;
  }
  poVar22 = (ostream *)std::ostream::operator<<(&std::cout,iVar11);
  std::endl<char,std::char_traits<char>>(poVar22);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (iVar11 = 0; iVar11 != 5; iVar11 = iVar11 + 1) {
    imrt::Plan::printIntensity(&P,iVar11);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_1f58,(string *)&file);
  get_angles(&l,&local_1f58,n_00);
  std::__cxx11::string::~string((string *)&local_1f58);
  iVar11 = (*_plot.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar11 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&intgen);
    poVar22 = std::operator<<((ostream *)local_2710,"python plotter/plot.py ");
    poVar22 = (ostream *)
              std::ostream::operator<<
                        (poVar22,(int)l._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                      _M_color / 5);
    poVar22 = std::operator<<(poVar22,"_");
    poVar22 = std::operator<<(poVar22,(string *)&strategy);
    poVar22 = std::operator<<(poVar22,"_");
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2980);
    poVar22 = std::operator<<(poVar22,"_");
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_297c);
    poVar22 = std::operator<<(poVar22,"_");
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_296c);
    poVar22 = std::operator<<(poVar22,"_");
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_2948);
    std::operator<<(poVar22,".pdf");
    std::__cxx11::stringbuf::str();
    system(s._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::stringstream::~stringstream((stringstream *)&intgen);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&l._M_t);
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  imrt::Plan::~Plan(&P);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmax.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  args::FlagBase::~FlagBase(&_plot.super_FlagBase);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_path);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file3);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file2);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file);
  args::FlagBase::~FlagBase((FlagBase *)&_alphaT);
  args::FlagBase::~FlagBase((FlagBase *)&_temperature);
  args::FlagBase::~FlagBase(&accept_sa.super_FlagBase);
  args::FlagBase::~FlagBase(&accept_best.super_FlagBase);
  args::Group::~Group(&accept);
  args::FlagBase::~FlagBase((FlagBase *)&_perturbation);
  args::FlagBase::~FlagBase(&do_perturbate.super_FlagBase);
  args::FlagBase::~FlagBase(&first_improv.super_FlagBase);
  args::FlagBase::~FlagBase(&best_improv.super_FlagBase);
  args::FlagBase::~FlagBase((FlagBase *)&_prob_intensity);
  args::FlagBase::~FlagBase(&ls_intensity.super_FlagBase);
  args::FlagBase::~FlagBase(&ls_aperture.super_FlagBase);
  args::FlagBase::~FlagBase(&_targeted_search.super_FlagBase);
  args::Group::~Group(&dao_ls);
  args::FlagBase::~FlagBase((FlagBase *)&_step_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_max_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_initial_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_open_apertures);
  args::FlagBase::~FlagBase((FlagBase *)&_max_apertures);
  args::FlagBase::~FlagBase(&all_rand.super_FlagBase);
  args::FlagBase::~FlagBase(&closed_max.super_FlagBase);
  args::FlagBase::~FlagBase(&closed_min.super_FlagBase);
  args::FlagBase::~FlagBase(&open_min.super_FlagBase);
  args::FlagBase::~FlagBase(&open_max.super_FlagBase);
  args::Group::~Group(&setup);
  args::FlagBase::~FlagBase((FlagBase *)&_beta);
  args::FlagBase::~FlagBase((FlagBase *)&_alpha);
  args::FlagBase::~FlagBase((FlagBase *)&_seed);
  args::FlagBase::~FlagBase((FlagBase *)&_maxtime);
  args::FlagBase::~FlagBase((FlagBase *)&_maxiter);
  args::FlagBase::~FlagBase((FlagBase *)&_maxratio);
  args::FlagBase::~FlagBase((FlagBase *)&_maxdelta);
  args::FlagBase::~FlagBase((FlagBase *)&_vsize);
  args::FlagBase::~FlagBase((FlagBase *)&_bsize);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_strategy);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  std::
  _Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ::~_Vector_base(&tabu_list_aper.
                   super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
                 );
  std::
  _Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ::~_Vector_base(&tabu_list_inten.
                   super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
                 );
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&file2);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&strategy);
  return 0;
}

Assistant:

int main(int argc, char** argv){

  // Target heuristic
  int vsize = 50;
  int bsize = 20;
  double maxdelta = 5.0;
  double maxratio = 3.0;

  // Budget and execution variables
  int maxiter = 5000;
  int maxtime = 0;
  int seed = time(NULL);

  // Intensity local search parameters
  double alpha = 1.0;
  double beta = 1.0;

  // Aperture and intensity configuration
  int max_apertures = 5;
  int open_apertures = -1;
  int initial_setup;
  int initial_intensity = 2;
  int max_intensity = 28;
  int step_intensity = 2;

  // Type of local search
  string strategy = "dao_ls";
  int ls_type = ApertureILS::FIRST_IMPROVEMENT;
  bool acceptance = ILS::ACCEPT_NONE;
  bool targeted_search = false;

  // Aperture representation local search
  bool search_aperture = false;
  bool search_intensity = false;
  double prob_intensity = 0.2;
  int perturbation = 2;
  double temperature;
  double initial_temperature = 10;
  double min_temperature = 0;
  double alphaT = 0.95;


  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";
  char* file3=NULL;

  string path=".";

  // Tabu list <<beam,station*>, open> for intensity
  vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  int tabusize=10;


	args::ArgumentParser parser("********* IMRT-Solver (Aperture solver) *********",
                             "Example.\n./AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  args::ValueFlag<string> _strategy (parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});

  args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
 // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});

  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});

  args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  args::Flag _targeted_search(dao_ls, "targeted_search", "Apply targeted local search", {"targeted"});
  args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});
  args::Flag best_improv(dao_ls, "best_improv", "Apply best improvement when searching intensity or apertures", {"best-improvement"});
  args::Flag first_improv(dao_ls, "first_improv", "Apply first improvement when searching intensity or apertures", {"first-improvement"});
  args::Flag do_perturbate(dao_ls, "do_perturbate", "Perturbate after a selected criterion is triggered", {"perturbate"});
  args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});

  args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});

	//args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<string> _file3(parser, "string", "File with initial intensities", {"file-sol"});
  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});
  args::Flag _plot(parser, "bool", "Generate plot and save in file", {"plot"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

	if(_strategy) strategy=_strategy.Get();

	if(_bsize) bsize=_bsize.Get();
	if(_vsize) vsize=_vsize.Get();
	if(_maxdelta) maxdelta=_maxdelta.Get();
	if(_maxratio) maxratio=_maxratio.Get();

	if(_maxiter) maxiter=_maxiter.Get();
	if(_maxtime) maxtime=_maxtime.Get();
	if(_seed) seed=_seed.Get();

	if(_alpha) alpha=_alpha.Get();
	if(_beta) beta=_beta.Get();

  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();

  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  if(_prob_intensity) prob_intensity=_prob_intensity.Get();

  if (_targeted_search) targeted_search = true;
  if (ls_aperture) search_aperture = true;
  if (ls_intensity) search_intensity = true;
  if(!ls_aperture && !ls_intensity){
    search_aperture=true;
    search_intensity=true;
  }
  if (_perturbation) perturbation=_perturbation.Get();

  if (first_improv) ls_type=ApertureILS::FIRST_IMPROVEMENT;
  if (best_improv) ls_type=ApertureILS::BEST_IMPROVEMENT;
  if (accept_sa) acceptance=ILS::ACCEPT_SA;
  if (accept_best) acceptance=ILS::ACCEPT_NONE;

  if(_temperature) temperature=initial_temperature=_temperature.Get();
  if(_alphaT) alphaT=_alphaT.Get();

  //This should be at the end given that will modify values
  if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    if(strategy=="dao_ls")
      initial_setup=Station::RAND_RAND_SETUP;
    else if (strategy=="ibo_ls")
      initial_setup=Station::RAND_INTENSITIES;
  } else {
    initial_setup=Station::MANUAL_SETUP;
  }

  srand(seed);
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_file3) file3=strdup(_file3.Get().c_str()); //intensidades de partida
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  if(strategy=="dao_ls") {
    cout << "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"<< endl;
  } else if(strategy=="ibo_ls") {
    cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  }
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup,file3);

  double best_eval=P.getEvaluation();

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##*********************************** INFO *********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##" << endl << "## Solver: "<< endl;
  cout << "##   Iterations: " << maxiter << endl;
  cout << "##   Time: " << maxtime << endl;
  cout << "##   Seed: " << seed << endl;
  cout << "##   Temperature: " << temperature << endl;
  cout << "##   alpha: " << alpha << endl;
  if (search_aperture)
    cout << "##   Searching: aperture pattern" << endl;
  if (search_intensity)
    cout << "##   Searching: intensity" << endl;
  cout << "##   Probability intensity ls: " << prob_intensity << endl;
  if (strategy=="dao_ls" && ls_type==ApertureILS::FIRST_IMPROVEMENT)
    cout << "##   Local search: first improvement"  << endl;
  if (strategy=="dao_ls" && ls_type==ApertureILS::BEST_IMPROVEMENT)
    cout << "##   Local search: best improvement"  << endl;
  if (strategy=="dao_ls" && targeted_search)
    cout << "##   Targeted search: yes"  << endl;
  if (strategy=="dao_ls" && !targeted_search)
    cout << "##   Targeted search: no"  << endl;

  cout << "##   Open initial setup: " ;
  if (initial_setup==Station::OPEN_MAX_SETUP) cout << "open max intensity" << endl;
  else if (initial_setup==Station::OPEN_MIN_SETUP) cout << "open min intensity" << endl;
  else if (initial_setup==Station::CLOSED_MAX_SETUP) cout << "closed max intensity" << endl;
  else if (initial_setup==Station::CLOSED_MIN_SETUP) cout << "closed min intensity" << endl;
  else if (initial_setup==Station::RAND_RAND_SETUP) cout << "random" << endl;
  else if (initial_setup==Station::RAND_INTENSITIES) cout << "random" << endl;
  else cout << "manual, " << open_apertures << " open apertures" << endl;
  cout << "##   Initial intensity: " << initial_intensity << endl;
  cout << "##   Max intensity: " << max_intensity << endl;
  cout << "##   Step intensity: " << step_intensity << endl;
  cout << "##   Perturbation size: " << perturbation << endl;
  cout << "##" << endl << "## Colimator configuration: "<< endl;
  cout << "##   Stations: " << collimator.getNbAngles() << endl;
  cout << "##   Angles: ";
  for (int i=0; i<collimator.getNbAngles();i++) cout << collimator.getAngle(i) << " ";
  cout << endl;
  cout << "##   Apertures: " << max_apertures << endl;


  cout << "##" << endl << "## Instance information: "<< endl;
  cout << "##   Volumes: " << volumes.size() << endl;

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##********************************** SEARCH ********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  cout << "## Initial solution: " << best_eval << endl;
  cout  << "##" << endl;
  
  cout << endl;
  for(int i=0;i<5;i++)
    P.printIntensity(i);
  cout << endl;

  ILS* ils;
  if(strategy=="dao_ls"){
    ils = new ApertureILS(bsize, vsize, search_intensity, search_aperture,
                          prob_intensity, step_intensity, initial_temperature,
                          alphaT, do_perturbate, perturbation, acceptance, ls_type);
   /* if (!targeted_search)*/
      ils-> notTargetedSearch(P, maxtime, maxiter);
    /*else
      ils-> beamTargetedSearch(P, maxtime, maxiter);*/
  }else if(strategy=="ibo_ls"){
/*
	    for(auto s:P.get_stations()){
	      for (int i=0; i<collimator.getXdim();i++) {
				  for (int j=0; j<collimator.getYdim(); j++) {
	          if(s->I(i,j)!=-1){
	        	  pair<double, double> vc=EvaluationFunction::getInstance().get_value_cost(
	        	              		s->getAngle(), s->pos2beam[make_pair(i,j)], Zmin, Zmax);
	            printf("%5.1f ",
	            vc.first);
	          }else cout << "   -1 " ;
	        }
	        cout << endl;
	      }
	      cout << endl;
	    }

	    for(auto s:P.get_stations()){
	      for (int i=0; i<collimator.getXdim();i++) {
				  for (int j=0; j<collimator.getYdim(); j++) {
	          if(s->I(i,j)!=-1){
	        	  pair<double, double> vc=EvaluationFunction::getInstance().get_value_cost(
	        	              		s->getAngle(), s->pos2beam[make_pair(i,j)], Zmin, Zmax);
	            printf("%6.1f ",
	            1/vc.second);
	          }else cout << "    -1 " ;
	        }
	        cout << endl;
	      }
	      cout << endl;
	    }
*/

    ils = new IntensityILS(step_intensity, bsize, vsize, maxdelta, maxratio, alpha, beta, perturbation);
    ils->beamTargetedSearch(P, maxtime, maxiter);


    
    cout << endl;
  	for(int i=0;i<5;i++)
  		P.printIntensity(i);
  	cout << endl;



    for(int i=0;i<50;i++) cout << ils->iLocalSearch(P, false) << endl;
    cout << P.eval() << endl  ;
  }else if(strategy=="intgen"){
	  IntensityGenerator intgen;
	  intgen.generate(P);
  }




  cout << "##**************************************************************************"<< endl;
  cout << "##******************************* RESULTS **********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  cout << "##"<<endl;
  cout << "## Best solution found: " <<  P.getEvaluation() << endl;

  cout <<  P.getEvaluation() << " ";

  const list<Station*> stations=P.get_stations();

  int tot_alpha=0;
  for(auto s:stations){
    int alpha=s->get_sum_alpha(strategy);
    cout << alpha << " " ;
    tot_alpha+=alpha;
  }
  cout << tot_alpha << " ";

  int nb_apertures=0;
  for(auto s:stations){
    int ap=s->get_nb_apertures(strategy);
    cout << ap << " " ;
    nb_apertures+=ap;
  }
  cout << nb_apertures << endl;


	cout << endl;
	for(int i=0;i<5;i++)
		P.printIntensity(i);

	cout << endl;

	/*cout << "********   Summary of the results    *********"<< endl;
	best_eval = F.eval(P,w,Zmin,Zmax);
	cout << "Final solution: " << best_eval << endl << endl;

  F.generate_voxel_dose_functions ();*/

  set<int> l = get_angles(file, 5);
  if(_plot){
	  std::stringstream ss;
	  ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
	  std::string s = ss.str();
	  system(s.c_str());
  }

	return 0;

}